

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O3

void iutest::detail::printer_internal2::DefaultPrintNonContainerTo<iutest::detail::NeMatcher<int>>
               (NeMatcher<int> *value,iu_ostream *os)

{
  string local_30;
  
  NeMatcher<int>::WhichIs_abi_cxx11_(&local_30,value);
  std::__ostream_insert<char,std::char_traits<char>>
            (os,local_30._M_dataplus._M_p,local_30._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void DefaultPrintNonContainerTo(const T& value, iu_ostream* os)
{
    using namespace ::iutest::detail::printer_internal; // NOLINT
    *os << value;
}